

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O2

string * __thiscall
lest::to_string<double,double>
          (string *__return_storage_ptr__,lest *this,double *lhs,string *op,double *rhs)

{
  ostream *poVar1;
  ostringstream os;
  ForNonContainerNonPointer<double,_std::string> FStack_1d8;
  ForNonContainerNonPointer<double,_std::string> local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  to_string<double>(&local_1b8,(double *)this);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  to_string<double>(&FStack_1d8,(double *)op);
  std::operator<<(poVar1,(string *)&FStack_1d8);
  std::__cxx11::string::~string((string *)&FStack_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}